

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O1

DdNode * cuddBddNPAndRecur(DdManager *manager,DdNode *f,DdNode *g)

{
  int *piVar1;
  uint index;
  uint uVar2;
  uint uVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  
  pDVar4 = manager->one;
  pDVar9 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
  pDVar8 = (DdNode *)((ulong)g & 0xfffffffffffffffe);
  if (pDVar9 == pDVar8) {
    if (f != g) {
      return (DdNode *)((ulong)pDVar4 ^ 1);
    }
    return pDVar4;
  }
  if (pDVar4 == pDVar8) {
    if (pDVar4 != g) {
      return g;
    }
    return f;
  }
  if (pDVar4 == pDVar9) {
    return f;
  }
  if (((pDVar9->ref != 1) || (pDVar8->ref != 1)) &&
     (pDVar4 = cuddCacheLookup2(manager,Cudd_bddNPAnd,f,g), pDVar4 != (DdNode *)0x0)) {
    return pDVar4;
  }
  index = pDVar9->index;
  uVar2 = manager->perm[index];
  uVar3 = manager->perm[pDVar8->index];
  if (uVar3 < uVar2) {
    if (((ulong)g & 1) == 0) {
      pDVar4 = (DdNode *)((ulong)(g->type).kids.T ^ 1);
      pDVar8 = (DdNode *)((ulong)(g->type).kids.E ^ 1);
    }
    else {
      pDVar4 = (pDVar8->type).kids.T;
      pDVar8 = (pDVar8->type).kids.E;
    }
    pDVar8 = cuddBddAndRecur(manager,pDVar4,pDVar8);
    if (pDVar8 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    pDVar4 = (DdNode *)((ulong)pDVar8 ^ 1);
    piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar8 = cuddBddNPAndRecur(manager,f,pDVar4);
    if (pDVar8 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_IterDerefBdd(manager,pDVar4);
      cuddCacheInsert2(manager,Cudd_bddNPAnd,f,g,pDVar8);
      piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      return pDVar8;
    }
  }
  else {
    pDVar4 = (pDVar9->type).kids.T;
    pDVar7 = (pDVar9->type).kids.E;
    pDVar6 = (DdNode *)((ulong)pDVar4 ^ 1);
    pDVar5 = (DdNode *)((ulong)pDVar7 ^ 1);
    if (((ulong)f & 1) == 0) {
      pDVar6 = pDVar4;
      pDVar5 = pDVar7;
    }
    pDVar4 = g;
    pDVar7 = g;
    if (uVar3 == uVar2) {
      pDVar4 = (pDVar8->type).kids.T;
      pDVar7 = (pDVar8->type).kids.E;
      if (((ulong)g & 1) != 0) {
        pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
        pDVar7 = (DdNode *)((ulong)pDVar7 ^ 1);
      }
    }
    pDVar4 = cuddBddAndRecur(manager,pDVar6,pDVar4);
    if (pDVar4 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    pDVar6 = (DdNode *)((ulong)pDVar4 & 0xfffffffffffffffe);
    pDVar6->ref = pDVar6->ref + 1;
    pDVar7 = cuddBddAndRecur(manager,pDVar5,pDVar7);
    if (pDVar7 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar5 = pDVar4;
      if (pDVar4 == pDVar7) {
LAB_007cf62f:
        piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        pDVar6->ref = pDVar6->ref - 1;
        if ((pDVar9->ref == 1) && (pDVar8->ref == 1)) {
          return pDVar5;
        }
        cuddCacheInsert2(manager,Cudd_bddNPAnd,f,g,pDVar5);
        return pDVar5;
      }
      if (((ulong)pDVar4 & 1) == 0) {
        pDVar5 = cuddUniqueInter(manager,index,pDVar4,pDVar7);
        if (pDVar5 != (DdNode *)0x0) goto LAB_007cf62f;
      }
      else {
        pDVar5 = cuddUniqueInter(manager,index,pDVar6,(DdNode *)((ulong)pDVar7 ^ 1));
        if (pDVar5 != (DdNode *)0x0) {
          pDVar5 = (DdNode *)((ulong)pDVar5 ^ 1);
          goto LAB_007cf62f;
        }
      }
      Cudd_IterDerefBdd(manager,pDVar4);
      pDVar4 = pDVar7;
    }
  }
  Cudd_IterDerefBdd(manager,pDVar4);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddBddNPAndRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * g)
{
    DdNode *F, *ft, *fe, *G, *gt, *ge;
    DdNode *one, *r, *t, *e;
    unsigned int topf, topg, index;

    statLine(manager);
    one = DD_ONE(manager);

    /* Terminal cases. */
    F = Cudd_Regular(f);
    G = Cudd_Regular(g);
    if (F == G) {
        if (f == g) return(one);
        else return(Cudd_Not(one));
    }
    if (G == one) {
        if (g == one) return(f);
        else return(g);
    }
    if (F == one) {
        return(f);
    }

    /* At this point f and g are not constant. */
    /* Check cache. */
    if (F->ref != 1 || G->ref != 1) {
        r = cuddCacheLookup2(manager, Cudd_bddNPAnd, f, g);
        if (r != NULL) return(r);
    }

    /* Here we can skip the use of cuddI, because the operands are known
    ** to be non-constant.
    */
    topf = manager->perm[F->index];
    topg = manager->perm[G->index];

    if (topg < topf) {  /* abstract top variable from g */
        DdNode *d;

        /* Find complements of cofactors of g. */
        if (Cudd_IsComplement(g)) {
            gt = cuddT(G);
            ge = cuddE(G);
        } else {
            gt = Cudd_Not(cuddT(g));
            ge = Cudd_Not(cuddE(g));
        }
        /* Take the OR by applying DeMorgan. */
        d = cuddBddAndRecur(manager, gt, ge);
        if (d == NULL) return(NULL);
        d = Cudd_Not(d);
        cuddRef(d);
        r = cuddBddNPAndRecur(manager, f, d);
        if (r == NULL) {
            Cudd_IterDerefBdd(manager, d);
            return(NULL);
        }
        cuddRef(r);
        Cudd_IterDerefBdd(manager, d);
        cuddCacheInsert2(manager, Cudd_bddNPAnd, f, g, r);
        cuddDeref(r);
        return(r);
    }

    /* Compute cofactors. */
    index = F->index;
    ft = cuddT(F);
    fe = cuddE(F);
    if (Cudd_IsComplement(f)) {
      ft = Cudd_Not(ft);
      fe = Cudd_Not(fe);
    }

    if (topg == topf) {
        gt = cuddT(G);
        ge = cuddE(G);
        if (Cudd_IsComplement(g)) {
            gt = Cudd_Not(gt);
            ge = Cudd_Not(ge);
        }
    } else {
        gt = ge = g;
    }

    t = cuddBddAndRecur(manager, ft, gt);
    if (t == NULL) return(NULL);
    cuddRef(t);

    e = cuddBddAndRecur(manager, fe, ge);
    if (e == NULL) {
        Cudd_IterDerefBdd(manager, t);
        return(NULL);
    }
    cuddRef(e);

    if (t == e) {
        r = t;
    } else {
        if (Cudd_IsComplement(t)) {
            r = cuddUniqueInter(manager,(int)index,Cudd_Not(t),Cudd_Not(e));
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
            r = Cudd_Not(r);
        } else {
            r = cuddUniqueInter(manager,(int)index,t,e);
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
        }
    }
    cuddDeref(e);
    cuddDeref(t);
    if (F->ref != 1 || G->ref != 1)
        cuddCacheInsert2(manager, Cudd_bddNPAnd, f, g, r);
    return(r);

}